

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<256U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator+=
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,
          uintwide_t<256U,_unsigned_short,_void,_false> *other)

{
  unsigned_fast_type i;
  long lVar1;
  uint uVar2;
  uintwide_t<256U,_unsigned_short,_void,_false> self;
  
  if (this == other) {
    self.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 8);
    self.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 0xc);
    self.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
         *(undefined8 *)(other->values).super_array<unsigned_short,_16UL>.elems;
    self.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_short,_16UL>.elems + 4);
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uint)self.values.super_array<unsigned_short,_16UL>.elems[lVar1] +
              (this->values).super_array<unsigned_short,_16UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_short,_16UL>.elems[lVar1] = (value_type_conflict3)uVar2;
      uVar2 = uVar2 >> 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uint)(other->values).super_array<unsigned_short,_16UL>.elems[lVar1] +
              (this->values).super_array<unsigned_short,_16UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_short,_16UL>.elems[lVar1] = (value_type_conflict3)uVar2;
      uVar2 = uVar2 >> 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }